

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

void Js::JavascriptOperators::TryCacheMissingProperty
               (Var instance,Var cacheInstance,bool isRoot,PropertyId propertyId,
               ScriptContext *requestContext,PropertyValueInfo *info)

{
  bool bVar1;
  BOOL BVar2;
  int iVar3;
  DynamicObject *pDVar4;
  Type *this;
  ThreadContext *this_00;
  DynamicType *this_01;
  DynamicTypeHandler *pDVar5;
  JavascriptLibrary *pJVar6;
  DynamicTypeHandler *handler;
  PropertyValueInfo *info_local;
  ScriptContext *requestContext_local;
  PropertyId propertyId_local;
  bool isRoot_local;
  Var cacheInstance_local;
  Var instance_local;
  
  bVar1 = Phases::IsEnabled((Phases *)&DAT_01eafdf0,MissingPropertyCachePhase);
  if (((!bVar1) && (!isRoot)) &&
     ((bVar1 = DynamicObject::IsBaseDynamicObject(instance), bVar1 ||
      (bVar1 = DynamicObject::IsAnyArray(instance), bVar1)))) {
    pDVar4 = UnsafeVarTo<Js::DynamicObject>(instance);
    this = RecyclableObject::GetType(&pDVar4->super_RecyclableObject);
    BVar2 = Js::Type::IsJsrtExternal(this);
    if (BVar2 != 0) {
      this_00 = ScriptContext::GetThreadContext(requestContext);
      bVar1 = ThreadContext::IsDisableImplicitCall(this_00);
      if (bVar1) {
        return;
      }
    }
    pDVar4 = UnsafeVarTo<Js::DynamicObject>(instance);
    this_01 = DynamicObject::GetDynamicType(pDVar4);
    pDVar5 = DynamicType::GetTypeHandler(this_01);
    iVar3 = (*pDVar5->_vptr_DynamicTypeHandler[0x4e])();
    if (iVar3 != 0) {
      bVar1 = Phases::IsEnabled((Phases *)&DAT_01ebe7c8,MissingPropertyCachePhase);
      if (bVar1) {
        ScriptContext::RecordMissingPropertyCacheAttempt(requestContext);
      }
      bVar1 = Phases::IsEnabled((Phases *)&DAT_01ec1678,MissingPropertyCachePhase);
      if (bVar1) {
        Output::Print(L"MissingPropertyCache: Caching missing property for property %d.\n",
                      (ulong)(uint)propertyId);
      }
      pJVar6 = ScriptContext::GetLibrary(requestContext);
      pDVar4 = JavascriptLibrary::GetMissingPropertyHolder(pJVar6);
      PropertyValueInfo::Set(info,&pDVar4->super_RecyclableObject,0,'\x04',InlineCacheNoFlags);
      pJVar6 = ScriptContext::GetLibrary(requestContext);
      pDVar4 = JavascriptLibrary::GetMissingPropertyHolder(pJVar6);
      CacheOperators::CachePropertyRead
                (cacheInstance,&pDVar4->super_RecyclableObject,isRoot,propertyId,true,info,
                 requestContext);
    }
  }
  return;
}

Assistant:

void JavascriptOperators::TryCacheMissingProperty(Var instance, Var cacheInstance, bool isRoot, PropertyId propertyId, ScriptContext* requestContext, _Inout_ PropertyValueInfo * info)
    {
        // Here, any well-behaved subclasses of DynamicObject can opt in to getting included in the missing property cache.
        // For now, we only include basic objects and arrays. 
        if (PHASE_OFF1(MissingPropertyCachePhase) || isRoot || !(DynamicObject::IsBaseDynamicObject(instance) || DynamicObject::IsAnyArray(instance)))
        {
            return;
        }

        // CustomExternalObject in particular is problematic because in some cases it can report missing when implicit callsare disabled.
        // See CustomExternalObject::GetPropertyQuery for an example.
        if (UnsafeVarTo<DynamicObject>(instance)->GetType()->IsJsrtExternal() && requestContext->GetThreadContext()->IsDisableImplicitCall())
        {
            return;
        }

        DynamicTypeHandler* handler = UnsafeVarTo<DynamicObject>(instance)->GetDynamicType()->GetTypeHandler();

        // Only cache missing property lookups for non-root field loads on objects that have PathTypeHandlers, because only these types have the right behavior
        // when the missing property is later added. DictionaryTypeHandler's introduce the possibility that a stale TypePropertyCache entry with isMissing==true can
        // be left in the cache after the property has been installed in the object's prototype chain. Other changes to optimize accesses to objects that don't
        // override special symbols make it unnecessary to introduce an invalidation scheme to deal with DictionaryTypeHandler's.

        if (!handler->IsPathTypeHandler())
        {
            return;
        }

#ifdef MISSING_PROPERTY_STATS
        if (PHASE_STATS1(MissingPropertyCachePhase))
        {
            requestContext->RecordMissingPropertyCacheAttempt();
        }
#endif
        if (PHASE_TRACE1(MissingPropertyCachePhase))
        {
            Output::Print(_u("MissingPropertyCache: Caching missing property for property %d.\n"), propertyId);
        }

        PropertyValueInfo::Set(info, requestContext->GetLibrary()->GetMissingPropertyHolder(), 0);
        CacheOperators::CachePropertyRead(cacheInstance, requestContext->GetLibrary()->GetMissingPropertyHolder(), isRoot, propertyId, true /*isMissing*/, info, requestContext);
    }